

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::Divide(VirtualMachine *this)

{
  element_type *peVar1;
  VariableType VVar2;
  anon_union_8_6_52c89740_for_Variable_1 aVar3;
  Variable VVar4;
  
  VVar4 = popOpStack(this);
  aVar3 = VVar4.field_1;
  VVar2 = VVar4.type;
  VVar4 = popOpStack(this);
  if (VVar4.type == VVar2) {
    if (VVar2 == Float) {
      pushFloat(this,VVar4.field_1.doubleValue / aVar3.doubleValue);
      goto LAB_001177af;
    }
    if ((VVar2 == Integer) && (aVar3 != 0.0)) {
      pushInteger(this,VVar4.field_1.integerValue / aVar3.integerValue);
      goto LAB_001177af;
    }
  }
  pushUndefined(this);
LAB_001177af:
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::Divide() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  if (!this->protectDifferentTypes(first, second)) {
    this->advance();
    return;
  }

  if (first.type == VariableType::Integer) {
    if (second.integerValue == 0) {
      this->pushUndefined();

    } else {
      this->pushInteger(first.integerValue / second.integerValue);
    }

  } else if (first.type == VariableType::Float) {
    this->pushFloat(first.doubleValue / second.doubleValue);

  } else {
    this->pushUndefined();
  }

  this->advance();
}